

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::microfacet::ndf(microfacet *this,vec3 *wm,args *args)

{
  float fVar1;
  float fVar2;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar3;
  vec3 vVar4;
  float_t nrmsqr;
  float local_3c;
  undefined1 local_38 [24];
  undefined8 local_20;
  float local_18;
  
  vVar4 = djb::operator*(&args->mtra,wm);
  fVar3 = vVar4.z;
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = vVar4._0_8_;
  local_38._12_4_ = extraout_XMM0_Dd;
  fVar1 = fVar3 * fVar3 + vVar4.x * vVar4.x + vVar4.y * vVar4.y;
  local_3c = fVar1;
  fVar2 = inversesqrt<float>(&local_3c);
  local_18 = fVar3 * fVar2;
  local_20 = CONCAT44(fVar2 * (float)local_38._4_4_,fVar2 * (float)local_38._0_4_);
  (*(this->super_brdf)._vptr_brdf[0xb])(this);
  return extraout_XMM0_Da * (args->detm / (fVar1 * fVar1));
}

Assistant:

float_t microfacet::ndf(const vec3 &wm, const args &args) const
{
	vec3 wm_std = args.mtra * wm;
	float_t nrmsqr = dot(wm_std, wm_std);
	return ndf_std(wm_std * inversesqrt(nrmsqr)) * (args.detm / sqr(nrmsqr));
}